

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_thread.cpp
# Opt level: O1

void * DrawerCommandQueue::AllocMemory(size_t size)

{
  char *pcVar1;
  ulong uVar2;
  
  Instance();
  uVar2 = (size + 0xf & 0xfffffffffffffff0) + Instance::queue.memorypool_pos;
  if (uVar2 < 0x1000001) {
    pcVar1 = Instance::queue.memorypool + Instance::queue.memorypool_pos;
    Instance::queue.memorypool_pos = uVar2;
  }
  else {
    pcVar1 = (char *)0x0;
  }
  return pcVar1;
}

Assistant:

void* DrawerCommandQueue::AllocMemory(size_t size)
{
	// Make sure allocations remain 16-byte aligned
	size = (size + 15) / 16 * 16;

	auto queue = Instance();
	if (queue->memorypool_pos + size > memorypool_size)
		return nullptr;

	void *data = queue->memorypool + queue->memorypool_pos;
	queue->memorypool_pos += size;
	return data;
}